

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

void __thiscall
duckdb::StrfTimeFormat::ConvertDateVector
          (StrfTimeFormat *this,Vector *input,Vector *result,idx_t count)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  int32_t *piVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  byte bVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  SelectionVector *pSVar11;
  data_ptr_t pdVar12;
  ulong uVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  void *pvVar16;
  void *pvVar17;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t iVar18;
  idx_t extraout_RDX_01;
  idx_t idx;
  ulong uVar19;
  idx_t iVar20;
  data_ptr_t pdVar21;
  idx_t *piVar22;
  idx_t idx_in_entry;
  ulong uVar23;
  ulong uVar24;
  void *pvVar25;
  string_t sVar26;
  anon_struct_16_3_d7536bce_for_pointer aVar27;
  undefined1 local_b8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  data_ptr_t local_90;
  data_ptr_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_b8._0_8_ = this;
  local_b8._8_8_ = result;
  if (input->vector_type == FLAT_VECTOR) {
    pvVar16 = (void *)count;
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar21 = result->data;
    pdVar4 = input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        piVar22 = (idx_t *)(pdVar21 + 8);
        iVar20 = 0;
        iVar18 = extraout_RDX;
        do {
          sVar26 = UnaryLambdaWrapperWithNulls::
                   Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                             ((date_t)*(int32_t *)(pdVar4 + iVar20 * 4),(ValidityMask *)local_b8,
                              iVar18,pvVar16);
          iVar18 = sVar26.value._8_8_;
          piVar22[-1] = sVar26.value._0_8_;
          *piVar22 = iVar18;
          iVar20 = iVar20 + 1;
          piVar22 = piVar22 + 2;
        } while (count != iVar20);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = count;
      local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)&input->validity,(unsigned_long *)&local_a8);
      pdVar12 = local_78.data;
      pSVar11 = local_78.sel;
      local_78.sel = (SelectionVector *)0x0;
      local_78.data = (data_ptr_t)0x0;
      p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pSVar11;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar12;
      if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
      }
      pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar14->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      if (0x3f < count + 0x3f) {
        pvVar16 = (void *)(count + 0x3f >> 6);
        pdVar21 = pdVar21 + 8;
        pvVar25 = (void *)0x0;
        iVar18 = extraout_RDX_00;
        uVar24 = 0;
        local_90 = pdVar21;
        do {
          puVar3 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar13 = count;
            }
LAB_014f2d76:
            uVar19 = uVar24;
            if (uVar24 < uVar13) {
              piVar22 = (idx_t *)(pdVar21 + uVar24 * 0x10);
              pvVar17 = pvVar16;
              do {
                sVar26 = UnaryLambdaWrapperWithNulls::
                         Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                                   ((date_t)*(int32_t *)(pdVar4 + uVar24 * 4),
                                    (ValidityMask *)local_b8,iVar18,pvVar17);
                iVar18 = sVar26.value._8_8_;
                piVar22[-1] = sVar26.value._0_8_;
                *piVar22 = iVar18;
                uVar24 = uVar24 + 1;
                piVar22 = piVar22 + 2;
                uVar19 = uVar13;
              } while (uVar13 != uVar24);
            }
          }
          else {
            uVar5 = puVar3[(long)pvVar25];
            uVar13 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar13 = count;
            }
            uVar19 = uVar13;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_014f2d76;
              uVar19 = uVar24;
              if (uVar24 < uVar13) {
                local_88 = pdVar4 + uVar24 * 4;
                piVar22 = (idx_t *)(pdVar21 + uVar24 * 0x10);
                uVar23 = 0;
                pvVar17 = pvVar16;
                do {
                  if ((uVar5 >> (uVar23 & 0x3f) & 1) != 0) {
                    sVar26 = UnaryLambdaWrapperWithNulls::
                             Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                                       ((date_t)*(int32_t *)(local_88 + uVar23 * 4),
                                        (ValidityMask *)local_b8,iVar18,pvVar17);
                    iVar18 = sVar26.value._8_8_;
                    piVar22[-1] = sVar26.value._0_8_;
                    *piVar22 = iVar18;
                  }
                  uVar23 = uVar23 + 1;
                  piVar22 = piVar22 + 2;
                  uVar19 = uVar13;
                  pdVar21 = local_90;
                } while (uVar13 - uVar24 != uVar23);
              }
            }
          }
          pvVar25 = (void *)((long)pvVar25 + 1);
          uVar24 = uVar19;
        } while (pvVar25 != pvVar16);
      }
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar1 = (anon_union_16_2_67f50693_for_value *)result->data;
    piVar2 = (int32_t *)input->data;
    puVar3 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    aVar27 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapperWithNulls::
             Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                       ((date_t)*piVar2,(ValidityMask *)local_b8,idx,(void *)count);
    paVar1->pointer = aVar27;
  }
  else {
    pvVar16 = (void *)count;
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar21 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        _Var6._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        piVar22 = (idx_t *)(pdVar21 + 8);
        uVar24 = 0;
        iVar18 = extraout_RDX_01;
        do {
          uVar13 = uVar24;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var6._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar13 = (ulong)*(uint *)((long)_Var6._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar24 * 4);
          }
          sVar26 = UnaryLambdaWrapperWithNulls::
                   Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                             ((date_t)*(int32_t *)((long)(_func_int ***)local_78.data + uVar13 * 4),
                              (ValidityMask *)local_b8,iVar18,pvVar16);
          iVar18 = sVar26.value._8_8_;
          piVar22[-1] = sVar26.value._0_8_;
          *piVar22 = iVar18;
          uVar24 = uVar24 + 1;
          piVar22 = piVar22 + 2;
        } while (count != uVar24);
      }
    }
    else if (count != 0) {
      _Var6._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
      pdVar21 = pdVar21 + 8;
      uVar24 = 0;
      do {
        uVar13 = uVar24;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var6._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar13 = (ulong)*(uint *)((long)_Var6._M_t.
                                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                          .super__Head_base<0UL,_unsigned_long_*,_false>.
                                          _M_head_impl + uVar24 * 4);
        }
        if (((ulong)local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
          _Var15._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var15._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var10 = p_Stack_a0;
            _Var9._M_pi = local_a8._M_pi;
            local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)_Var9._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var15._M_head_impl =
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var15._M_head_impl;
          }
          bVar8 = (byte)uVar24 & 0x3f;
          _Var15._M_head_impl[uVar24 >> 6] =
               _Var15._M_head_impl[uVar24 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          sVar26 = UnaryLambdaWrapperWithNulls::
                   Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                             ((date_t)*(int32_t *)((long)(_func_int ***)local_78.data + uVar13 * 4),
                              (ValidityMask *)local_b8,uVar13 >> 6,
                              (void *)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                                      validity_mask[uVar13 >> 6]);
          *(long *)(pdVar21 + -8) = sVar26.value._0_8_;
          *(long *)pdVar21 = sVar26.value._8_8_;
        }
        uVar24 = uVar24 + 1;
        pdVar21 = pdVar21 + 0x10;
      } while (count != uVar24);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void StrfTimeFormat::ConvertDateVector(Vector &input, Vector &result, idx_t count) {
	D_ASSERT(input.GetType().id() == LogicalTypeId::DATE);
	D_ASSERT(result.GetType().id() == LogicalTypeId::VARCHAR);
	UnaryExecutor::ExecuteWithNulls<date_t, string_t>(
	    input, result, count, [&](date_t input, ValidityMask &mask, idx_t idx) {
		    if (Date::IsFinite(input)) {
			    dtime_t time(0);
			    idx_t len = GetLength(input, time, 0, nullptr);
			    string_t target = StringVector::EmptyString(result, len);
			    FormatString(input, time, target.GetDataWriteable());
			    target.Finalize();
			    return target;
		    } else {
			    return StringVector::AddString(result, Date::ToString(input));
		    }
	    });
}